

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

bool __thiscall DConversationMenu::MenuEvent(DConversationMenu *this,int mkey,bool fromcontroller)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  FStrifeDialogueNode **ppFVar4;
  bool fromcontroller_local;
  int mkey_local;
  DConversationMenu *this_local;
  
  iVar2 = mSelection;
  if (demoplayback) {
    if (mkey == 7) {
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else if (mkey == 0) {
    mSelection = mSelection + -1;
    if (mSelection < 0) {
      uVar1 = TArray<unsigned_int,_unsigned_int>::Size(&this->mResponses);
      mSelection = uVar1 - 1;
    }
    this_local._7_1_ = true;
  }
  else if (mkey == 1) {
    iVar2 = mSelection + 1;
    mSelection = iVar2;
    uVar1 = TArray<unsigned_int,_unsigned_int>::Size(&this->mResponses);
    if ((int)uVar1 <= iVar2) {
      mSelection = 0;
    }
    this_local._7_1_ = true;
  }
  else if (mkey == 7) {
    Net_WriteByte('=');
    (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
    this_local._7_1_ = true;
  }
  else if (mkey == 6) {
    uVar1 = TArray<unsigned_int,_unsigned_int>::Size(&this->mResponses);
    if ((uint)iVar2 < uVar1) {
      uVar1 = this->mCurNode->ThisNodeNum;
      uVar3 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Size(&StrifeDialogues);
      if (uVar3 <= uVar1) {
        __assert_fail("(unsigned)mCurNode->ThisNodeNum < StrifeDialogues.Size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_conversation.cpp"
                      ,0x33c,"virtual bool DConversationMenu::MenuEvent(int, bool)");
      }
      ppFVar4 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::operator[]
                          (&StrifeDialogues,(long)this->mCurNode->ThisNodeNum);
      if (*ppFVar4 != this->mCurNode) {
        __assert_fail("StrifeDialogues[mCurNode->ThisNodeNum] == mCurNode",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_conversation.cpp"
                      ,0x33d,"virtual bool DConversationMenu::MenuEvent(int, bool)");
      }
      Net_WriteByte(';');
      Net_WriteWord((short)this->mCurNode->ThisNodeNum);
      Net_WriteByte((BYTE)mSelection);
    }
    else {
      Net_WriteByte('<');
    }
    (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MenuEvent(int mkey, bool fromcontroller)
	{
		if (demoplayback)
		{ // During demo playback, don't let the user do anything besides close this menu.
			if (mkey == MKEY_Back)
			{
				Close();
				return true;
			}
			return false;
		}
		if (mkey == MKEY_Up)
		{
			if (--mSelection < 0) mSelection = mResponses.Size() - 1;
			return true;
		}
		else if (mkey == MKEY_Down)
		{
			if (++mSelection >= (int)mResponses.Size()) mSelection = 0;
			return true;
		}
		else if (mkey == MKEY_Back)
		{
			Net_WriteByte (DEM_CONVNULL);
			Close();
			return true;
		}
		else if (mkey == MKEY_Enter)
		{
			if ((unsigned)mSelection >= mResponses.Size())
			{
				Net_WriteByte(DEM_CONVCLOSE);
			}
			else
			{
				// Send dialogue and reply numbers across the wire.
				assert((unsigned)mCurNode->ThisNodeNum < StrifeDialogues.Size());
				assert(StrifeDialogues[mCurNode->ThisNodeNum] == mCurNode);
				Net_WriteByte(DEM_CONVREPLY);
				Net_WriteWord(mCurNode->ThisNodeNum);
				Net_WriteByte(mSelection);
			}
			Close();
			return true;
		}
		return false;
	}